

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::InstrumentPass::GenReadFunctionCall
          (InstrumentPass *this,uint32_t return_id,uint32_t func_id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *func_call_args,
          InstructionBuilder *ref_builder)

{
  bool bVar1;
  uint32_t uVar2;
  mapped_type *pmVar3;
  Instruction *this_00;
  InstructionBuilder builder;
  InstructionBuilder local_58;
  iterator local_38;
  
  if (this->opt_direct_reads_ == true) {
    pmVar3 = std::__detail::
             _Map_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_spvtools::opt::InstrumentPass::vector_hash_,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_spvtools::opt::InstrumentPass::vector_hash_,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->call2id_,func_call_args);
    if (*pmVar3 != 0) {
      return *pmVar3;
    }
  }
  InstructionBuilder::InstructionBuilder
            (&local_58,ref_builder->context_,(ref_builder->insert_before_).super_iterator.node_,
             ref_builder->preserved_analyses_);
  if ((this->opt_direct_reads_ == true) && (bVar1 = AllConstant(this,func_call_args), bVar1)) {
    BasicBlock::tail((BasicBlock *)&stack0xffffffffffffffc8);
    local_58.parent_ = IRContext::get_instr_block(local_58.context_,local_38.node_);
    local_58.insert_before_.super_iterator.node_ = (iterator)(iterator)local_38.node_;
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  this_00 = InstructionBuilder::AddFunctionCall(&local_58,return_id,func_id,func_call_args);
  uVar2 = Instruction::result_id(this_00);
  if (bVar1) {
    pmVar3 = std::__detail::
             _Map_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_spvtools::opt::InstrumentPass::vector_hash_,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_spvtools::opt::InstrumentPass::vector_hash_,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->call2id_,func_call_args);
    *pmVar3 = uVar2;
  }
  return uVar2;
}

Assistant:

uint32_t InstrumentPass::GenReadFunctionCall(
    uint32_t return_id, uint32_t func_id,
    const std::vector<uint32_t>& func_call_args,
    InstructionBuilder* ref_builder) {
  // If optimizing direct reads and the call has already been generated,
  // use its result
  if (opt_direct_reads_) {
    uint32_t res_id = call2id_[func_call_args];
    if (res_id != 0) return res_id;
  }
  // If the function arguments are all constants, the call can be moved to the
  // first block of the function where its result can be reused. One example
  // where this is profitable is for uniform buffer references, of which there
  // are often many.
  InstructionBuilder builder(ref_builder->GetContext(),
                             &*ref_builder->GetInsertPoint(),
                             ref_builder->GetPreservedAnalysis());
  bool insert_in_first_block = opt_direct_reads_ && AllConstant(func_call_args);
  if (insert_in_first_block) {
    Instruction* insert_before = &*curr_func_->begin()->tail();
    builder.SetInsertPoint(insert_before);
  }
  uint32_t res_id =
      builder.AddFunctionCall(return_id, func_id, func_call_args)->result_id();
  if (insert_in_first_block) call2id_[func_call_args] = res_id;
  return res_id;
}